

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_free(_glist *x)

{
  void *fatso;
  _canvasenvironment *p_Var1;
  _glist *p_Var2;
  int oldstate;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  _glist *p_Var3;
  _glist **pp_Var4;
  
  fatso = x->gl_privatedata;
  oldstate = canvas_suspend_dsp();
  canvas_noundo(x);
  if (canvas_whichfind == x) {
    canvas_whichfind = (_glist *)0x0;
  }
  glist_noselect(x);
  p_Var3 = extraout_RAX;
  while (x->gl_list != (t_gobj *)0x0) {
    glist_delete(x,x->gl_list);
    p_Var3 = extraout_RAX_00;
  }
  p_Var3 = glist_getcanvas(p_Var3);
  if (p_Var3 == x) {
    canvas_vis(x,0.0);
  }
  if (x->gl_editor != (t_editor *)0x0) {
    canvas_destroy_editor(x);
  }
  canvas_unbind(x);
  p_Var1 = x->gl_env;
  if (p_Var1 != (_canvasenvironment *)0x0) {
    freebytes(p_Var1->ce_argv,(long)p_Var1->ce_argc << 4);
    freebytes(x->gl_env,0x28);
  }
  canvas_undo_free(x);
  freebytes(fatso,0x20);
  canvas_resume_dsp(oldstate);
  freebytes(x->gl_xlabel,(long)x->gl_nxlabels << 3);
  freebytes(x->gl_ylabel,(long)x->gl_nylabels << 3);
  gstub_cutoff(x->gl_stub);
  pdgui_stub_deleteforkey(x);
  if ((x->gl_owner == (_glist *)0x0) && ((x->field_0xe9 & 8) == 0)) {
    p_Var3 = pd_maininstance.pd_canvaslist;
    if (pd_maininstance.pd_canvaslist == x) {
      pp_Var4 = &pd_maininstance.pd_canvaslist;
LAB_00135156:
      *pp_Var4 = x->gl_next;
    }
    else {
      do {
        p_Var2 = p_Var3->gl_next;
        if (p_Var2 == x) {
          pp_Var4 = &p_Var3->gl_next;
          goto LAB_00135156;
        }
        p_Var3 = p_Var2;
      } while (p_Var2 != (_glist *)0x0);
    }
  }
  return;
}

Assistant:

void canvas_free(t_canvas *x)
{
    t_gobj *y;
    t_canvas_private*private = x->gl_privatedata;
    int dspstate = canvas_suspend_dsp();
    canvas_noundo(x);
    if (canvas_whichfind == x)
        canvas_whichfind = 0;
    glist_noselect(x);
    while ((y = x->gl_list))
        glist_delete(x, y);
    if (x == glist_getcanvas(x))
        canvas_vis(x, 0);
    if (x->gl_editor)
        canvas_destroy_editor(x);   /* bug workaround; should already be gone*/
    canvas_unbind(x);

    if (x->gl_env)
    {
        freebytes(x->gl_env->ce_argv, x->gl_env->ce_argc * sizeof(t_atom));
        freebytes(x->gl_env, sizeof(*x->gl_env));
    }
    canvas_undo_free(x);
    freebytes(private, sizeof(*private));
    canvas_resume_dsp(dspstate);
    freebytes(x->gl_xlabel, x->gl_nxlabels * sizeof(*(x->gl_xlabel)));
    freebytes(x->gl_ylabel, x->gl_nylabels * sizeof(*(x->gl_ylabel)));
    gstub_cutoff(x->gl_stub);
    pdgui_stub_deleteforkey(x);        /* probably unnecessary */
    if (!x->gl_owner && !x->gl_isclone)
        canvas_takeofflist(x);
}